

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseTracking::SectionTracker::~SectionTracker(SectionTracker *this)

{
  (this->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.super_IShared.
  super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__SectionTracker_00181250;
  std::
  vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::~vector(&(this->super_TrackerBase).m_children);
  std::__cxx11::string::~string((string *)&(this->super_TrackerBase).m_name);
  return;
}

Assistant:

TrackerBase::~TrackerBase() {}